

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::Limiter::Release(Limiter *this)

{
  Limiter *this_local;
  
  LOCK();
  (this->acquires_allowed_).super___atomic_base<int>._M_i =
       (this->acquires_allowed_).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void Release() { acquires_allowed_.fetch_add(1, std::memory_order_relaxed); }